

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  uint64_t value;
  ulong uVar2;
  ulong uVar3;
  size_t i_1;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  anon_struct_72_9_85cf892b gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  anon_struct_72_9_85cf892b *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = &gcFrame;
  gcFrame.captureValue = 0;
  gcFrame.closure = 0;
  gcFrame.captureVector = 0;
  gcFrame.captureBinding = 0;
  gcFrame.functionDefinition = (sysbvm_functionDefinition_t *)0x0;
  gcFrame.captureList = 0;
  gcFrame.argumentNode = 0;
  gcFrame.argumentCount = 0;
  gcFrame.name = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 9;
  sysbvm_stackFrame_pushRecord(&local_48);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  uVar6 = *(ulong *)(*arguments + 0x40);
  bVar7 = (uVar6 & 0xf) != 0;
  if (bVar7 || uVar6 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(*(uint *)(uVar6 + 0xc) >> 3);
  }
  value = 0;
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    if (bVar7 || uVar6 == 0) {
      gcFrame.argumentNode = 0;
    }
    else {
      gcFrame.argumentNode = *(ulong *)(uVar6 + 0x10 + uVar2 * 8);
    }
    uVar3 = 1;
    if ((gcFrame.argumentNode & 0xf) == 0 && gcFrame.argumentNode != 0) {
      uVar3 = (ulong)(*(long *)(gcFrame.argumentNode + 0x28) != 0x1f);
    }
    value = value + uVar3;
  }
  gcFrame.argumentCount = sysbvm_tuple_uint64_encode(context,value);
  sVar1 = *arguments;
  gcFrame.functionDefinition =
       (sysbvm_functionDefinition_t *)
       sysbvm_functionDefinition_create
                 (context,*(sysbvm_tuple_t *)(sVar1 + 0x10),*(sysbvm_tuple_t *)(sVar1 + 0x30),
                  *(sysbvm_tuple_t *)(sVar1 + 0x38),gcFrame.argumentCount,arguments[1],
                  *(sysbvm_tuple_t *)(sVar1 + 0x40),*(sysbvm_tuple_t *)(sVar1 + 0x48),
                  *(sysbvm_tuple_t *)(sVar1 + 0x50));
  if ((*(long *)(*arguments + 0x58) == 0) || (*(long *)(*arguments + 0x58) == 0x1f)) {
    sysbvm_functionDefinition_ensureTypeAnalysis(context,&gcFrame.functionDefinition);
    gcFrame.closure =
         sysbvm_function_createClosureWithCaptureEnvironment
                   (context,(sysbvm_tuple_t)gcFrame.functionDefinition,arguments[1]);
    sysbvm_environment_enqueuePendingAnalysis(context,arguments[1],gcFrame.closure);
  }
  else {
    sysbvm_functionDefinition_ensureAnalysis(context,&gcFrame.functionDefinition);
    sVar1 = (gcFrame.functionDefinition)->bytecode;
    if (sVar1 == 0) {
      sVar1 = (gcFrame.functionDefinition)->sourceAnalyzedDefinition;
      lVar5 = 0x20;
      if (sVar1 == 0) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:1466: assertion failure: gcFrame.functionDefinition->sourceAnalyzedDefinition"
                  );
        sVar1 = (gcFrame.functionDefinition)->sourceAnalyzedDefinition;
      }
    }
    else {
      lVar5 = 0x48;
    }
    gcFrame.captureList = *(ulong *)(sVar1 + lVar5);
    if ((gcFrame.captureList & 0xf) == 0 && gcFrame.captureList != 0) {
      uVar6 = (ulong)(*(uint *)(gcFrame.captureList + 0xc) >> 3);
    }
    else {
      uVar6 = 0;
    }
    gcFrame.captureVector =
         sysbvm_sequenceTuple_create(context,(gcFrame.functionDefinition)->captureVectorType);
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      if ((gcFrame.captureList & 0xf) == 0 && gcFrame.captureList != 0) {
        uVar2 = *(ulong *)(gcFrame.captureList + 0x10 + uVar4 * 8);
      }
      else {
        uVar2 = 0;
      }
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        gcFrame.captureBinding = *(sysbvm_tuple_t *)(uVar2 + 0x48);
      }
      else {
        gcFrame.captureBinding = 0;
      }
      gcFrame.captureValue =
           sysbvm_environment_evaluateSymbolBinding(context,arguments[1],gcFrame.captureBinding);
      if ((gcFrame.captureVector & 0xf) == 0 && gcFrame.captureVector != 0) {
        *(sysbvm_tuple_t *)(gcFrame.captureVector + 0x10 + uVar4 * 8) = gcFrame.captureValue;
      }
    }
    gcFrame.closure =
         sysbvm_function_createClosureWithCaptureVector
                   (context,(sysbvm_tuple_t)gcFrame.functionDefinition,gcFrame.captureVector);
  }
  if (*(sysbvm_tuple_t *)(*arguments + 0x28) != 0) {
    gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                             (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
    if (gcFrame.name != 0) {
      sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition
                (context,arguments[1],gcFrame.name,gcFrame.closure,
                 *(sysbvm_tuple_t *)(*arguments + 0x10));
    }
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.closure;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentCount;
        sysbvm_functionDefinition_t* functionDefinition;
        
        sysbvm_tuple_t captureList;
        sysbvm_tuple_t captureVector;
        sysbvm_tuple_t captureBinding;
        sysbvm_tuple_t captureValue;
        sysbvm_tuple_t closure;
        sysbvm_tuple_t name;
    } gcFrame = {0};

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*lambdaNode)->super.sourcePosition);

    // Count the actual argument count.
    size_t lambdaArgumentCount = 0;
    size_t argumentNodeCount = sysbvm_array_getSize((*lambdaNode)->arguments);
    for(size_t i = 0; i < argumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*lambdaNode)->arguments, i);
        if(!sysbvm_astArgumentNode_isForAll(gcFrame.argumentNode))
            ++lambdaArgumentCount;
    }

    gcFrame.argumentCount = sysbvm_tuple_size_encode(context,  lambdaArgumentCount);
    gcFrame.functionDefinition = (sysbvm_functionDefinition_t*)sysbvm_functionDefinition_create(context,
        (*lambdaNode)->super.sourcePosition, (*lambdaNode)->flags, (*lambdaNode)->callingConventionName,
        gcFrame.argumentCount, *environment,
        (*lambdaNode)->arguments, (*lambdaNode)->resultType, (*lambdaNode)->body
    );
    
    if((*lambdaNode)->hasLazyAnalysis && !sysbvm_tuple_boolean_decode((*lambdaNode)->hasLazyAnalysis))
    {
        sysbvm_functionDefinition_ensureAnalysis(context, &gcFrame.functionDefinition);

        if(gcFrame.functionDefinition->bytecode)
        {
            gcFrame.captureList = ((sysbvm_functionBytecode_t*)gcFrame.functionDefinition->bytecode)->captures;
        }
        else
        {
            SYSBVM_ASSERT(gcFrame.functionDefinition->sourceAnalyzedDefinition);
            gcFrame.captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.functionDefinition->sourceAnalyzedDefinition)->captures;
        }

        size_t captureVectorSize = sysbvm_array_getSize(gcFrame.captureList);
        gcFrame.captureVector = sysbvm_sequenceTuple_create(context, gcFrame.functionDefinition->captureVectorType);
        for(size_t i = 0; i < captureVectorSize; ++i)
        {
            gcFrame.captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(gcFrame.captureList, i));
            gcFrame.captureValue = sysbvm_environment_evaluateSymbolBinding(context, *environment, gcFrame.captureBinding);
            sysbvm_array_atPut(gcFrame.captureVector, i, gcFrame.captureValue);
        }
        gcFrame.closure = sysbvm_function_createClosureWithCaptureVector(context, (sysbvm_tuple_t)gcFrame.functionDefinition, gcFrame.captureVector);
    }
    else
    {
        sysbvm_functionDefinition_ensureTypeAnalysis(context, &gcFrame.functionDefinition);
        gcFrame.closure = sysbvm_function_createClosureWithCaptureEnvironment(context, (sysbvm_tuple_t)gcFrame.functionDefinition, *environment);
        sysbvm_environment_enqueuePendingAnalysis(context, *environment, gcFrame.closure);
    }

    if((*lambdaNode)->name)
    {
        gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*lambdaNode)->name, *environment);
        if(gcFrame.name)
            sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition(context, *environment, gcFrame.name, gcFrame.closure, (*lambdaNode)->super.sourcePosition);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.closure;
}